

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::ListOp<long>::~ListOp(ListOp<long> *this)

{
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->ordered_items).super__Vector_base<long,_std::allocator<long>_>);
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->deleted_items).super__Vector_base<long,_std::allocator<long>_>);
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->appended_items).super__Vector_base<long,_std::allocator<long>_>);
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->prepended_items).super__Vector_base<long,_std::allocator<long>_>);
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->added_items).super__Vector_base<long,_std::allocator<long>_>);
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->explicit_items).super__Vector_base<long,_std::allocator<long>_>);
  return;
}

Assistant:

ListOp() : is_explicit(false) {}